

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::
SetWhat<char_const*&,char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char (*args_2) [13],
          char **args_3,char *args_4,char **args_5,char (*args_6) [7],char **args_7)

{
  std::operator<<((ostream *)oss,*arg);
  SetWhat<char,int&,char_const(&)[13],char_const*&,char,char_const*,char_const(&)[7],char_const*>
            (this,oss,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }